

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFExpression::Operation::extract
          (Operation *this,DataExtractor Data,uint16_t Version,uint8_t AddressSize,uint64_t Offset)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint64_t uVar9;
  undefined1 uVar10;
  uint8_t uVar11;
  Encoding EVar12;
  ulong uVar13;
  long lVar14;
  uint64_t local_38;
  uint64_t Offset_local;
  
  local_38 = Offset;
  bVar4 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
  this->Opcode = bVar4;
  if ((getOpDesc(unsigned_int)::Descriptions == '\0') &&
     (iVar8 = __cxa_guard_acquire(&getOpDesc(unsigned_int)::Descriptions), iVar8 != 0)) {
    getDescriptions();
    __cxa_atexit(std::
                 vector<llvm::DWARFExpression::Operation::Description,_std::allocator<llvm::DWARFExpression::Operation::Description>_>
                 ::~vector,&getOpDesc(unsigned_int)::Descriptions,&__dso_handle);
    __cxa_guard_release(&getOpDesc(unsigned_int)::Descriptions);
  }
  uVar1 = (ulong)bVar4;
  uVar13 = (DAT_010b2e78 - getOpDesc(unsigned_int)::Descriptions) * -0x5555555555555555;
  if (uVar13 < uVar1 || uVar13 - uVar1 == 0) {
    EVar12 = SizeNA;
    cVar5 = '\0';
    uVar10 = 0xff;
  }
  else {
    lVar14 = uVar1 * 3;
    cVar5 = *(char *)(getOpDesc(unsigned_int)::Descriptions + lVar14);
    uVar10 = *(undefined1 *)(getOpDesc(unsigned_int)::Descriptions + 1 + lVar14);
    EVar12 = *(Encoding *)(getOpDesc(unsigned_int)::Descriptions + 2 + lVar14);
  }
  (this->Desc).Op[1] = EVar12;
  (this->Desc).Version = cVar5;
  (this->Desc).Op[0] = uVar10;
  if (cVar5 != '\0') {
    uVar11 = '\x04';
    if (Version == 2) {
      uVar11 = AddressSize;
    }
    lVar14 = 0;
    bVar3 = true;
    do {
      bVar2 = bVar3;
      EVar12 = (this->Desc).Op[lVar14];
      if (EVar12 == SizeNA) break;
      switch(EVar12 & ~SignBit) {
      case Size1:
        bVar4 = DataExtractor::getU8(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar14] = (ulong)bVar4;
        if (-1 < (char)EVar12) goto LAB_00d72b37;
        uVar9 = (uint64_t)(char)bVar4;
        goto LAB_00d72b32;
      case Size2:
        uVar6 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar14] = (ulong)uVar6;
        if ((char)EVar12 < '\0') {
          uVar9 = (uint64_t)(short)uVar6;
          goto LAB_00d72b32;
        }
        goto LAB_00d72b37;
      case Size4:
        uVar7 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
        this->Operands[lVar14] = (ulong)uVar7;
        if ((char)EVar12 < '\0') {
          uVar9 = (uint64_t)(int)uVar7;
          goto LAB_00d72b32;
        }
        goto LAB_00d72b37;
      case Size8:
        break;
      case SizeLEB:
        if ((char)EVar12 < '\0') {
          uVar9 = DataExtractor::getSLEB128(&Data,&local_38);
          goto LAB_00d72b32;
        }
      case BaseTypeRef:
        uVar9 = DataExtractor::getULEB128(&Data,&local_38,(Error *)0x0);
        goto LAB_00d72b32;
      case SizeAddr:
        if (AddressSize == '\x02') {
LAB_00d72b11:
          uVar6 = DataExtractor::getU16(&Data,&local_38,(Error *)0x0);
          uVar9 = (uint64_t)uVar6;
          goto LAB_00d72b32;
        }
        if (AddressSize == '\x04') {
LAB_00d72afe:
          uVar7 = DataExtractor::getU32(&Data,&local_38,(Error *)0x0);
          uVar9 = (uint64_t)uVar7;
          goto LAB_00d72b32;
        }
        if (AddressSize != '\b') {
          __assert_fail("AddressSize == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xa5,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
        break;
      case SizeRefAddr:
        if (uVar11 == '\x02') goto LAB_00d72b11;
        if (uVar11 == '\x04') goto LAB_00d72afe;
        if (uVar11 != '\b') {
          __assert_fail("getRefAddrSize(AddressSize, Version) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                        ,0xaf,
                        "bool llvm::DWARFExpression::Operation::extract(DataExtractor, uint16_t, uint8_t, uint64_t)"
                       );
        }
        break;
      case SizeBlock:
        if (bVar2) {
          return false;
        }
        this->Operands[lVar14] = local_38;
        local_38 = local_38 + this->Operands[0];
        this->OperandEndOffsets[lVar14] = local_38;
        goto LAB_00d72b5c;
      default:
        llvm_unreachable_internal
                  ("Unknown DWARFExpression Op size",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                   ,0xc5);
      }
      uVar9 = DataExtractor::getU64(&Data,&local_38,(Error *)0x0);
LAB_00d72b32:
      this->Operands[lVar14] = uVar9;
LAB_00d72b37:
      this->OperandEndOffsets[lVar14] = local_38;
      lVar14 = 1;
      bVar3 = false;
    } while (bVar2);
  }
LAB_00d72b5c:
  this->EndOffset = local_38;
  return cVar5 != '\0';
}

Assistant:

bool DWARFExpression::Operation::extract(DataExtractor Data, uint16_t Version,
                                         uint8_t AddressSize, uint64_t Offset) {
  Opcode = Data.getU8(&Offset);

  Desc = getOpDesc(Opcode);
  if (Desc.Version == Operation::DwarfNA) {
    EndOffset = Offset;
    return false;
  }

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    switch (Size & ~Operation::SignBit) {
    case Operation::Size1:
      Operands[Operand] = Data.getU8(&Offset);
      if (Signed)
        Operands[Operand] = (int8_t)Operands[Operand];
      break;
    case Operation::Size2:
      Operands[Operand] = Data.getU16(&Offset);
      if (Signed)
        Operands[Operand] = (int16_t)Operands[Operand];
      break;
    case Operation::Size4:
      Operands[Operand] = Data.getU32(&Offset);
      if (Signed)
        Operands[Operand] = (int32_t)Operands[Operand];
      break;
    case Operation::Size8:
      Operands[Operand] = Data.getU64(&Offset);
      break;
    case Operation::SizeAddr:
      if (AddressSize == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (AddressSize == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(AddressSize == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeRefAddr:
      if (getRefAddrSize(AddressSize, Version) == 8) {
        Operands[Operand] = Data.getU64(&Offset);
      } else if (getRefAddrSize(AddressSize, Version) == 4) {
        Operands[Operand] = Data.getU32(&Offset);
      } else {
        assert(getRefAddrSize(AddressSize, Version) == 2);
        Operands[Operand] = Data.getU16(&Offset);
      }
      break;
    case Operation::SizeLEB:
      if (Signed)
        Operands[Operand] = Data.getSLEB128(&Offset);
      else
        Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::BaseTypeRef:
      Operands[Operand] = Data.getULEB128(&Offset);
      break;
    case Operation::SizeBlock:
      // We need a size, so this cannot be the first operand
      if (Operand == 0)
        return false;
      // Store the offset of the block as the value.
      Operands[Operand] = Offset;
      Offset += Operands[Operand - 1];
      break;
    default:
      llvm_unreachable("Unknown DWARFExpression Op size");
    }

    OperandEndOffsets[Operand] = Offset;
  }

  EndOffset = Offset;
  return true;
}